

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O1

size_t absl::strings_internal::Base64EscapeInternal
                 (uchar *src,size_t szsrc,char *dest,size_t szdest,char *base64,bool do_padding)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  char *pcVar6;
  ushort uVar7;
  ushort uVar8;
  uint *puVar9;
  char *pcVar10;
  uchar *puVar11;
  
  if (szdest * 3 <= szsrc * 4 && szsrc * 4 + szdest * -3 != 0) {
    return 0;
  }
  pcVar5 = dest;
  puVar9 = (uint *)src;
  if ((2 < szsrc) && (src < src + (szsrc - 3))) {
    do {
      uVar1 = *puVar9;
      uVar3 = (uVar1 & 0xff0000) >> 8;
      uVar2 = uVar3 | (uVar1 & 0xff00) << 8;
      *pcVar5 = base64[(uVar1 << 0x18) >> 0x1a];
      pcVar5[1] = base64[(uVar2 | uVar1 << 0x18) >> 0x14 & 0x3f];
      pcVar5[2] = base64[(uVar2 & 0xfc000) >> 0xe];
      pcVar5[3] = base64[(uVar3 & 0x3f00) >> 8];
      pcVar5 = pcVar5 + 4;
      puVar9 = (uint *)((long)puVar9 + 3);
    } while (puVar9 < src + (szsrc - 3));
  }
  puVar11 = src + (szsrc - (long)puVar9);
  if ((uchar *)0x3 < puVar11) {
    raw_log_internal::RawLog(kFatal,"escaping.cc",0xc9,"Logic problem? szsrc = %zu",puVar11);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/internal/escaping.cc"
                  ,0xc9,
                  "size_t absl::strings_internal::Base64EscapeInternal(const unsigned char *, size_t, char *, size_t, const char *, bool)"
                 );
  }
  pcVar6 = dest + (szdest - (long)pcVar5);
  switch(puVar11) {
  case (uchar *)0x0:
    goto switchD_00304395_caseD_0;
  case (uchar *)0x1:
    if (pcVar6 < (char *)0x2) {
      return 0;
    }
    uVar1 = *puVar9;
    *pcVar5 = base64[(byte)((byte)uVar1 >> 2)];
    pcVar5[1] = base64[((byte)uVar1 & 3) << 4];
    pcVar10 = pcVar5 + 2;
    bVar4 = true;
    if (do_padding) {
      if (((ulong)pcVar6 & 0xfffffffffffffffe) == 2) goto LAB_00304431;
      pcVar5[2] = '=';
      pcVar5[3] = '=';
LAB_0030448e:
      bVar4 = true;
      pcVar10 = pcVar5 + 4;
    }
    break;
  case (uchar *)0x2:
    if (pcVar6 < (char *)0x3) {
      return 0;
    }
    uVar8 = (ushort)*puVar9 << 8;
    uVar7 = uVar8 | (ushort)*puVar9 >> 8;
    *pcVar5 = base64[uVar8 >> 10];
    pcVar5[1] = base64[uVar7 >> 4 & 0x3f];
    pcVar5[2] = base64[(ulong)(uVar7 & 0xf) * 4];
    pcVar10 = pcVar5 + 3;
    bVar4 = true;
    if (do_padding) {
      if (pcVar6 != (char *)0x3) {
        pcVar5[3] = '=';
        goto LAB_0030448e;
      }
LAB_00304431:
      bVar4 = false;
    }
    break;
  case (uchar *)0x3:
    if (pcVar6 < (char *)0x4) {
      return 0;
    }
    uVar1 = *puVar9;
    uVar8 = *(ushort *)((long)puVar9 + 1) << 8 | *(ushort *)((long)puVar9 + 1) >> 8;
    *pcVar5 = base64[(byte)((byte)uVar1 >> 2)];
    pcVar5[1] = base64[(((byte)uVar1 & 3) << 0x10 | (uint)uVar8) >> 0xc];
    pcVar5[2] = base64[uVar8 >> 6 & 0x3f];
    pcVar5[3] = base64[uVar8 & 0x3f];
    pcVar5 = pcVar5 + 4;
    goto switchD_00304395_caseD_0;
  }
  pcVar5 = pcVar10;
  if (!bVar4) {
    return 0;
  }
switchD_00304395_caseD_0:
  return (long)pcVar5 - (long)dest;
}

Assistant:

size_t Base64EscapeInternal(const unsigned char* src, size_t szsrc, char* dest,
                            size_t szdest, const char* base64,
                            bool do_padding) {
  static const char kPad64 = '=';

  if (szsrc * 4 > szdest * 3) return 0;

  char* cur_dest = dest;
  const unsigned char* cur_src = src;

  char* const limit_dest = dest + szdest;
  const unsigned char* const limit_src = src + szsrc;

  // (from https://tools.ietf.org/html/rfc3548)
  // Special processing is performed if fewer than 24 bits are available
  // at the end of the data being encoded.  A full encoding quantum is
  // always completed at the end of a quantity.  When fewer than 24 input
  // bits are available in an input group, zero bits are added (on the
  // right) to form an integral number of 6-bit groups.
  //
  // If do_padding is true, padding at the end of the data is performed. This
  // output padding uses the '=' character.

  // Three bytes of data encodes to four characters of cyphertext.
  // So we can pump through three-byte chunks atomically.
  if (szsrc >= 3) {                    // "limit_src - 3" is UB if szsrc < 3.
    while (cur_src < limit_src - 3) {  // While we have >= 32 bits.
      uint32_t in = absl::big_endian::Load32(cur_src) >> 8;

      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];

      cur_dest += 4;
      cur_src += 3;
    }
  }
  // To save time, we didn't update szdest or szsrc in the loop.  So do it now.
  szdest = static_cast<size_t>(limit_dest - cur_dest);
  szsrc = static_cast<size_t>(limit_src - cur_src);

  /* now deal with the tail (<=3 bytes) */
  switch (szsrc) {
    case 0:
      // Nothing left; nothing more to do.
      break;
    case 1: {
      // One byte left: this encodes to two characters, and (optionally)
      // two pad characters to round out the four-character cypherblock.
      if (szdest < 2) return 0;
      uint32_t in = cur_src[0];
      cur_dest[0] = base64[in >> 2];
      in &= 0x3;
      cur_dest[1] = base64[in << 4];
      cur_dest += 2;
      szdest -= 2;
      if (do_padding) {
        if (szdest < 2) return 0;
        cur_dest[0] = kPad64;
        cur_dest[1] = kPad64;
        cur_dest += 2;
        szdest -= 2;
      }
      break;
    }
    case 2: {
      // Two bytes left: this encodes to three characters, and (optionally)
      // one pad character to round out the four-character cypherblock.
      if (szdest < 3) return 0;
      uint32_t in = absl::big_endian::Load16(cur_src);
      cur_dest[0] = base64[in >> 10];
      in &= 0x3FF;
      cur_dest[1] = base64[in >> 4];
      in &= 0x00F;
      cur_dest[2] = base64[in << 2];
      cur_dest += 3;
      szdest -= 3;
      if (do_padding) {
        if (szdest < 1) return 0;
        cur_dest[0] = kPad64;
        cur_dest += 1;
        szdest -= 1;
      }
      break;
    }
    case 3: {
      // Three bytes left: same as in the big loop above.  We can't do this in
      // the loop because the loop above always reads 4 bytes, and the fourth
      // byte is past the end of the input.
      if (szdest < 4) return 0;
      uint32_t in =
          (uint32_t{cur_src[0]} << 16) + absl::big_endian::Load16(cur_src + 1);
      cur_dest[0] = base64[in >> 18];
      in &= 0x3FFFF;
      cur_dest[1] = base64[in >> 12];
      in &= 0xFFF;
      cur_dest[2] = base64[in >> 6];
      in &= 0x3F;
      cur_dest[3] = base64[in];
      cur_dest += 4;
      szdest -= 4;
      break;
    }
    default:
      // Should not be reached: blocks of 4 bytes are handled
      // in the while loop before this switch statement.
      ABSL_RAW_LOG(FATAL, "Logic problem? szsrc = %zu", szsrc);
      break;
  }
  return static_cast<size_t>(cur_dest - dest);
}